

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

TopKLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_topk(NeuralNetworkLayer *this)

{
  bool bVar1;
  TopKLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_topk(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_topk(this);
    this_00 = (TopKLayerParams *)operator_new(0x28);
    TopKLayerParams::TopKLayerParams(this_00);
    (this->layer_).topk_ = this_00;
  }
  return (TopKLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::TopKLayerParams* NeuralNetworkLayer::mutable_topk() {
  if (!has_topk()) {
    clear_layer();
    set_has_topk();
    layer_.topk_ = new ::CoreML::Specification::TopKLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.topK)
  return layer_.topk_;
}